

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatTimeInMillisAsSeconds_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  _Setprecision _Var1;
  ostream *poVar2;
  int local_1d0;
  int local_1cc;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [376];
  internal *local_18;
  TimeInMillis ms_local;
  
  local_18 = this;
  ms_local = (TimeInMillis)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,std::fixed);
  if ((long)local_18 % 1000 == 0) {
    local_1cc = 0;
  }
  else {
    if ((long)local_18 % 100 == 0) {
      local_1d0 = 1;
    }
    else {
      local_1d0 = 3;
      if ((long)local_18 % 10 == 0) {
        local_1d0 = 2;
      }
    }
    local_1cc = local_1d0;
  }
  _Var1 = std::setprecision(local_1cc);
  poVar2 = std::operator<<(poVar2,_Var1);
  std::ostream::operator<<(poVar2,std::showpoint);
  std::ostream::operator<<(local_190,(double)(long)local_18 * 0.001);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatTimeInMillisAsSeconds(TimeInMillis ms) {
  ::std::stringstream ss;
  // For the exact N seconds, makes sure output has a trailing decimal point.
  // Sets precision so that we won't have many trailing zeros (e.g., 300 ms
  // will be just 0.3, 410 ms 0.41, and so on)
  ss << std::fixed
     << std::setprecision(
            ms % 1000 == 0 ? 0 : (ms % 100 == 0 ? 1 : (ms % 10 == 0 ? 2 : 3)))
     << std::showpoint;
  ss << (static_cast<double>(ms) * 1e-3);
  return ss.str();
}